

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbistbl.cpp
# Opt level: O0

void __thiscall
icu_63::RBBISymbolTable::addEntry
          (RBBISymbolTable *this,UnicodeString *key,RBBINode *val,UErrorCode *err)

{
  UBool UVar1;
  void *pvVar2;
  RBBISymbolTableEntry *this_00;
  UnicodeString *size;
  RBBISymbolTableEntry *local_60;
  RBBISymbolTableEntry *e;
  UErrorCode *err_local;
  RBBINode *val_local;
  UnicodeString *key_local;
  RBBISymbolTable *this_local;
  
  UVar1 = ::U_FAILURE(*err);
  if (UVar1 == '\0') {
    size = key;
    pvVar2 = uhash_get_63(this->fHashTable,key);
    if (pvVar2 == (void *)0x0) {
      this_00 = (RBBISymbolTableEntry *)UMemory::operator_new((UMemory *)0x50,(size_t)size);
      local_60 = (RBBISymbolTableEntry *)0x0;
      if (this_00 != (RBBISymbolTableEntry *)0x0) {
        RBBISymbolTableEntry::RBBISymbolTableEntry(this_00);
        local_60 = this_00;
      }
      if (local_60 == (RBBISymbolTableEntry *)0x0) {
        *err = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        UnicodeString::operator=(&local_60->key,key);
        local_60->val = val;
        uhash_put_63(this->fHashTable,&local_60->key,local_60,err);
      }
    }
    else {
      *err = U_BRK_VARIABLE_REDFINITION;
    }
  }
  return;
}

Assistant:

void            RBBISymbolTable::addEntry  (const UnicodeString &key, RBBINode *val, UErrorCode &err) {
    RBBISymbolTableEntry *e;
    /* test for buffer overflows */
    if (U_FAILURE(err)) {
        return;
    }
    e = (RBBISymbolTableEntry *)uhash_get(fHashTable, &key);
    if (e != NULL) {
        err = U_BRK_VARIABLE_REDFINITION;
        return;
    }

    e = new RBBISymbolTableEntry;
    if (e == NULL) {
        err = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    e->key = key;
    e->val = val;
    uhash_put( fHashTable, &e->key, e, &err);
}